

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fIndexedStateQueryTests.cpp
# Opt level: O0

int __thiscall
deqp::gles31::Functional::IndexedStateQueryTests::init
          (IndexedStateQueryTests *this,EVP_PKEY_CTX *ctx)

{
  Context *pCVar1;
  int iVar2;
  SampleMaskCase *this_00;
  char *pcVar3;
  MinValueIndexed3Case *pMVar4;
  BufferBindingCase *pBVar5;
  BufferStartCase *pBVar6;
  BufferSizeCase *pBVar7;
  ImageBindingNameCase *this_01;
  ImageBindingLevelCase *this_02;
  ImageBindingLayeredCase *this_03;
  ImageBindingLayerCase *this_04;
  ImageBindingAccessCase *this_05;
  ImageBindingFormatCase *this_06;
  EnableBlendCase *this_07;
  ColorMaskCase *this_08;
  BlendFuncCase *this_09;
  BlendEquationCase *this_10;
  BlendEquationAdvancedCase *this_11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_978;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_958;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_938;
  char *local_918;
  char *verifierSuffix_19;
  int local_908;
  QueryType verifier_19;
  int verifierNdx_18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8c0;
  char *local_8a0;
  char *verifierSuffix_18;
  int local_890;
  QueryType verifier_18;
  int verifierNdx_17;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_868;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_848;
  char *local_828;
  char *verifierSuffix_17;
  int local_818;
  QueryType verifier_17;
  int verifierNdx_16;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7d0;
  char *local_7b0;
  char *verifierSuffix_16;
  int local_7a0;
  QueryType verifier_16;
  int verifierNdx_15;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_778;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_758;
  char *local_738;
  char *verifierSuffix_15;
  QueryType verifier_15;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_708;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6e8;
  char *local_6c8;
  char *verifierSuffix_14;
  int local_6b8;
  QueryType verifier_14;
  int verifierNdx_14;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_690;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_670;
  char *local_650;
  char *verifierSuffix_13;
  int local_640;
  QueryType verifier_13;
  int verifierNdx_13;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_618;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5f8;
  char *local_5d8;
  char *verifierSuffix_12;
  int local_5c8;
  QueryType verifier_12;
  int verifierNdx_12;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_580;
  char *local_560;
  char *verifierSuffix_11;
  int local_550;
  QueryType verifier_11;
  int verifierNdx_11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_528;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_508;
  char *local_4e8;
  char *verifierSuffix_10;
  int local_4d8;
  QueryType verifier_10;
  int verifierNdx_10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_490;
  char *local_470;
  char *verifierSuffix_9;
  int local_460;
  QueryType verifier_9;
  int verifierNdx_9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_438;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_418;
  char *local_3f8;
  char *verifierSuffix_8;
  int local_3e8;
  QueryType verifier_8;
  int verifierNdx_8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3a0;
  char *local_380;
  char *verifierSuffix_7;
  int local_370;
  QueryType verifier_7;
  int verifierNdx_7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_348;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_328;
  char *local_308;
  char *verifierSuffix_6;
  int local_2f8;
  QueryType verifier_6;
  int verifierNdx_6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b0;
  char *local_290;
  char *verifierSuffix_5;
  int local_280;
  QueryType verifier_5;
  int verifierNdx_5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238;
  char *local_218;
  char *verifierSuffix_4;
  int local_208;
  QueryType verifier_4;
  int verifierNdx_4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  char *local_1a0;
  char *verifierSuffix_3;
  QueryType verifier_3;
  int verifierNdx_3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  char *local_120;
  char *verifierSuffix_2;
  QueryType verifier_2;
  int verifierNdx_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  char *local_a0;
  char *verifierSuffix_1;
  QueryType verifier_1;
  int verifierNdx_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  char *local_20;
  char *verifierSuffix;
  QueryType verifier;
  int verifierNdx;
  IndexedStateQueryTests *this_local;
  
  _verifier = this;
  for (verifierSuffix._4_4_ = 0; verifierSuffix._4_4_ < 3;
      verifierSuffix._4_4_ = verifierSuffix._4_4_ + 1) {
    verifierSuffix._0_4_ = init::verifiers[verifierSuffix._4_4_];
    local_20 = anon_unknown_1::getVerifierSuffix((QueryType)verifierSuffix);
    this_00 = (SampleMaskCase *)operator_new(0x80);
    verifier_1._3_1_ = 1;
    pCVar1 = (this->super_TestCaseGroup).m_context;
    std::__cxx11::string::string((string *)&local_80);
    std::operator+(&local_60,&local_80,"sample_mask_value_");
    std::operator+(&local_40,&local_60,local_20);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    anon_unknown_1::SampleMaskCase::SampleMaskCase
              (this_00,pCVar1,pcVar3,"Test SAMPLE_MASK_VALUE",(QueryType)verifierSuffix);
    verifier_1._3_1_ = QUERY_BOOLEAN >> 0x18;
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_00);
    std::__cxx11::string::~string((string *)&local_40);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&local_80);
  }
  for (verifierSuffix_1._4_4_ = 0; verifierSuffix_1._4_4_ < 3;
      verifierSuffix_1._4_4_ = verifierSuffix_1._4_4_ + 1) {
    verifierSuffix_1._0_4_ = init::verifiers[verifierSuffix_1._4_4_];
    local_a0 = anon_unknown_1::getVerifierSuffix((QueryType)verifierSuffix_1);
    pMVar4 = (MinValueIndexed3Case *)operator_new(0x90);
    verifier_2._3_1_ = 1;
    pCVar1 = (this->super_TestCaseGroup).m_context;
    std::__cxx11::string::string((string *)&local_100);
    std::operator+(&local_e0,&local_100,"max_compute_work_group_count_");
    std::operator+(&local_c0,&local_e0,local_a0);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    tcu::Vector<int,_3>::Vector((Vector<int,_3> *)&verifierNdx_2,0xffff,0xffff,0xffff);
    anon_unknown_1::MinValueIndexed3Case::MinValueIndexed3Case
              (pMVar4,pCVar1,pcVar3,"Test MAX_COMPUTE_WORK_GROUP_COUNT",0x91be,
               (IVec3 *)&verifierNdx_2,(QueryType)verifierSuffix_1);
    verifier_2._3_1_ = QUERY_BOOLEAN >> 0x18;
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)pMVar4);
    std::__cxx11::string::~string((string *)&local_c0);
    std::__cxx11::string::~string((string *)&local_e0);
    std::__cxx11::string::~string((string *)&local_100);
  }
  for (verifierSuffix_2._4_4_ = 0; verifierSuffix_2._4_4_ < 3;
      verifierSuffix_2._4_4_ = verifierSuffix_2._4_4_ + 1) {
    verifierSuffix_2._0_4_ = init::verifiers[verifierSuffix_2._4_4_];
    local_120 = anon_unknown_1::getVerifierSuffix((QueryType)verifierSuffix_2);
    pMVar4 = (MinValueIndexed3Case *)operator_new(0x90);
    verifier_3._3_1_ = 1;
    pCVar1 = (this->super_TestCaseGroup).m_context;
    std::__cxx11::string::string((string *)&local_180);
    std::operator+(&local_160,&local_180,"max_compute_work_group_size_");
    std::operator+(&local_140,&local_160,local_120);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    tcu::Vector<int,_3>::Vector((Vector<int,_3> *)&verifierNdx_3,0x80,0x80,0x40);
    anon_unknown_1::MinValueIndexed3Case::MinValueIndexed3Case
              (pMVar4,pCVar1,pcVar3,"Test MAX_COMPUTE_WORK_GROUP_SIZE",0x91bf,
               (IVec3 *)&verifierNdx_3,(QueryType)verifierSuffix_2);
    verifier_3._3_1_ = QUERY_BOOLEAN >> 0x18;
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)pMVar4);
    std::__cxx11::string::~string((string *)&local_140);
    std::__cxx11::string::~string((string *)&local_160);
    std::__cxx11::string::~string((string *)&local_180);
  }
  for (verifierSuffix_3._4_4_ = 0; verifierSuffix_3._4_4_ < 3;
      verifierSuffix_3._4_4_ = verifierSuffix_3._4_4_ + 1) {
    verifierSuffix_3._0_4_ = init::verifiers[verifierSuffix_3._4_4_];
    local_1a0 = anon_unknown_1::getVerifierSuffix((QueryType)verifierSuffix_3);
    pBVar5 = (BufferBindingCase *)operator_new(0x88);
    verifier_4._3_1_ = 1;
    pCVar1 = (this->super_TestCaseGroup).m_context;
    std::__cxx11::string::string((string *)&verifierNdx_4);
    std::operator+(&local_1e0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &verifierNdx_4,"atomic_counter_buffer_binding_");
    std::operator+(&local_1c0,&local_1e0,local_1a0);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    anon_unknown_1::BufferBindingCase::BufferBindingCase
              (pBVar5,pCVar1,pcVar3,"Test ATOMIC_COUNTER_BUFFER_BINDING",0x92c1,0x92c0,0x92dc,
               (QueryType)verifierSuffix_3);
    verifier_4._3_1_ = QUERY_BOOLEAN >> 0x18;
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)pBVar5);
    std::__cxx11::string::~string((string *)&local_1c0);
    std::__cxx11::string::~string((string *)&local_1e0);
    std::__cxx11::string::~string((string *)&verifierNdx_4);
  }
  for (local_208 = 0; local_208 < 3; local_208 = local_208 + 1) {
    verifierSuffix_4._4_4_ = init::verifiers[local_208];
    local_218 = anon_unknown_1::getVerifierSuffix(verifierSuffix_4._4_4_);
    pBVar6 = (BufferStartCase *)operator_new(0x88);
    verifier_5._3_1_ = 1;
    pCVar1 = (this->super_TestCaseGroup).m_context;
    std::__cxx11::string::string((string *)&verifierNdx_5);
    std::operator+(&local_258,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &verifierNdx_5,"atomic_counter_buffer_start_");
    std::operator+(&local_238,&local_258,local_218);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    anon_unknown_1::BufferStartCase::BufferStartCase
              (pBVar6,pCVar1,pcVar3,"Test ATOMIC_COUNTER_BUFFER_START",0x92c2,0x92c0,0x92dc,
               verifierSuffix_4._4_4_);
    verifier_5._3_1_ = QUERY_BOOLEAN >> 0x18;
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)pBVar6);
    std::__cxx11::string::~string((string *)&local_238);
    std::__cxx11::string::~string((string *)&local_258);
    std::__cxx11::string::~string((string *)&verifierNdx_5);
  }
  for (local_280 = 0; local_280 < 3; local_280 = local_280 + 1) {
    verifierSuffix_5._4_4_ = init::verifiers[local_280];
    local_290 = anon_unknown_1::getVerifierSuffix(verifierSuffix_5._4_4_);
    pBVar7 = (BufferSizeCase *)operator_new(0x88);
    verifier_6._3_1_ = 1;
    pCVar1 = (this->super_TestCaseGroup).m_context;
    std::__cxx11::string::string((string *)&verifierNdx_6);
    std::operator+(&local_2d0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &verifierNdx_6,"atomic_counter_buffer_size_");
    std::operator+(&local_2b0,&local_2d0,local_290);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    anon_unknown_1::BufferSizeCase::BufferSizeCase
              (pBVar7,pCVar1,pcVar3,"Test ATOMIC_COUNTER_BUFFER_SIZE",0x92c3,0x92c0,0x92dc,
               verifierSuffix_5._4_4_);
    verifier_6._3_1_ = QUERY_BOOLEAN >> 0x18;
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)pBVar7);
    std::__cxx11::string::~string((string *)&local_2b0);
    std::__cxx11::string::~string((string *)&local_2d0);
    std::__cxx11::string::~string((string *)&verifierNdx_6);
  }
  for (local_2f8 = 0; local_2f8 < 3; local_2f8 = local_2f8 + 1) {
    verifierSuffix_6._4_4_ = init::verifiers[local_2f8];
    local_308 = anon_unknown_1::getVerifierSuffix(verifierSuffix_6._4_4_);
    pBVar5 = (BufferBindingCase *)operator_new(0x88);
    verifier_7._3_1_ = 1;
    pCVar1 = (this->super_TestCaseGroup).m_context;
    std::__cxx11::string::string((string *)&verifierNdx_7);
    std::operator+(&local_348,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &verifierNdx_7,"shader_storage_buffer_binding_");
    std::operator+(&local_328,&local_348,local_308);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    anon_unknown_1::BufferBindingCase::BufferBindingCase
              (pBVar5,pCVar1,pcVar3,"Test SHADER_STORAGE_BUFFER_BINDING",0x90d3,0x90d2,0x90dd,
               verifierSuffix_6._4_4_);
    verifier_7._3_1_ = QUERY_BOOLEAN >> 0x18;
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)pBVar5);
    std::__cxx11::string::~string((string *)&local_328);
    std::__cxx11::string::~string((string *)&local_348);
    std::__cxx11::string::~string((string *)&verifierNdx_7);
  }
  for (local_370 = 0; local_370 < 3; local_370 = local_370 + 1) {
    verifierSuffix_7._4_4_ = init::verifiers[local_370];
    local_380 = anon_unknown_1::getVerifierSuffix(verifierSuffix_7._4_4_);
    pBVar6 = (BufferStartCase *)operator_new(0x88);
    verifier_8._3_1_ = 1;
    pCVar1 = (this->super_TestCaseGroup).m_context;
    std::__cxx11::string::string((string *)&verifierNdx_8);
    std::operator+(&local_3c0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &verifierNdx_8,"shader_storage_buffer_start_");
    std::operator+(&local_3a0,&local_3c0,local_380);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    anon_unknown_1::BufferStartCase::BufferStartCase
              (pBVar6,pCVar1,pcVar3,"Test SHADER_STORAGE_BUFFER_START",0x90d4,0x90d2,0x90dd,
               verifierSuffix_7._4_4_);
    verifier_8._3_1_ = QUERY_BOOLEAN >> 0x18;
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)pBVar6);
    std::__cxx11::string::~string((string *)&local_3a0);
    std::__cxx11::string::~string((string *)&local_3c0);
    std::__cxx11::string::~string((string *)&verifierNdx_8);
  }
  for (local_3e8 = 0; local_3e8 < 3; local_3e8 = local_3e8 + 1) {
    verifierSuffix_8._4_4_ = init::verifiers[local_3e8];
    local_3f8 = anon_unknown_1::getVerifierSuffix(verifierSuffix_8._4_4_);
    pBVar7 = (BufferSizeCase *)operator_new(0x88);
    verifier_9._3_1_ = 1;
    pCVar1 = (this->super_TestCaseGroup).m_context;
    std::__cxx11::string::string((string *)&verifierNdx_9);
    std::operator+(&local_438,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &verifierNdx_9,"shader_storage_buffer_size_");
    std::operator+(&local_418,&local_438,local_3f8);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    anon_unknown_1::BufferSizeCase::BufferSizeCase
              (pBVar7,pCVar1,pcVar3,"Test SHADER_STORAGE_BUFFER_SIZE",0x90d5,0x90d2,0x90dd,
               verifierSuffix_8._4_4_);
    verifier_9._3_1_ = QUERY_BOOLEAN >> 0x18;
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)pBVar7);
    std::__cxx11::string::~string((string *)&local_418);
    std::__cxx11::string::~string((string *)&local_438);
    std::__cxx11::string::~string((string *)&verifierNdx_9);
  }
  for (local_460 = 0; local_460 < 3; local_460 = local_460 + 1) {
    verifierSuffix_9._4_4_ = init::verifiers[local_460];
    local_470 = anon_unknown_1::getVerifierSuffix(verifierSuffix_9._4_4_);
    this_01 = (ImageBindingNameCase *)operator_new(0x80);
    verifier_10._3_1_ = 1;
    pCVar1 = (this->super_TestCaseGroup).m_context;
    std::__cxx11::string::string((string *)&verifierNdx_10);
    std::operator+(&local_4b0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &verifierNdx_10,"image_binding_name_");
    std::operator+(&local_490,&local_4b0,local_470);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    anon_unknown_1::ImageBindingNameCase::ImageBindingNameCase
              (this_01,pCVar1,pcVar3,"Test IMAGE_BINDING_NAME",verifierSuffix_9._4_4_);
    verifier_10._3_1_ = QUERY_BOOLEAN >> 0x18;
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_01);
    std::__cxx11::string::~string((string *)&local_490);
    std::__cxx11::string::~string((string *)&local_4b0);
    std::__cxx11::string::~string((string *)&verifierNdx_10);
  }
  for (local_4d8 = 0; local_4d8 < 3; local_4d8 = local_4d8 + 1) {
    verifierSuffix_10._4_4_ = init::verifiers[local_4d8];
    local_4e8 = anon_unknown_1::getVerifierSuffix(verifierSuffix_10._4_4_);
    this_02 = (ImageBindingLevelCase *)operator_new(0x80);
    verifier_11._3_1_ = 1;
    pCVar1 = (this->super_TestCaseGroup).m_context;
    std::__cxx11::string::string((string *)&verifierNdx_11);
    std::operator+(&local_528,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &verifierNdx_11,"image_binding_level_");
    std::operator+(&local_508,&local_528,local_4e8);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    anon_unknown_1::ImageBindingLevelCase::ImageBindingLevelCase
              (this_02,pCVar1,pcVar3,"Test IMAGE_BINDING_LEVEL",verifierSuffix_10._4_4_);
    verifier_11._3_1_ = QUERY_BOOLEAN >> 0x18;
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_02);
    std::__cxx11::string::~string((string *)&local_508);
    std::__cxx11::string::~string((string *)&local_528);
    std::__cxx11::string::~string((string *)&verifierNdx_11);
  }
  for (local_550 = 0; local_550 < 3; local_550 = local_550 + 1) {
    verifierSuffix_11._4_4_ = init::verifiers[local_550];
    local_560 = anon_unknown_1::getVerifierSuffix(verifierSuffix_11._4_4_);
    this_03 = (ImageBindingLayeredCase *)operator_new(0x80);
    verifier_12._3_1_ = 1;
    pCVar1 = (this->super_TestCaseGroup).m_context;
    std::__cxx11::string::string((string *)&verifierNdx_12);
    std::operator+(&local_5a0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &verifierNdx_12,"image_binding_layered_");
    std::operator+(&local_580,&local_5a0,local_560);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    anon_unknown_1::ImageBindingLayeredCase::ImageBindingLayeredCase
              (this_03,pCVar1,pcVar3,"Test IMAGE_BINDING_LAYERED",verifierSuffix_11._4_4_);
    verifier_12._3_1_ = QUERY_BOOLEAN >> 0x18;
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_03);
    std::__cxx11::string::~string((string *)&local_580);
    std::__cxx11::string::~string((string *)&local_5a0);
    std::__cxx11::string::~string((string *)&verifierNdx_12);
  }
  for (local_5c8 = 0; local_5c8 < 3; local_5c8 = local_5c8 + 1) {
    verifierSuffix_12._4_4_ = init::verifiers[local_5c8];
    local_5d8 = anon_unknown_1::getVerifierSuffix(verifierSuffix_12._4_4_);
    this_04 = (ImageBindingLayerCase *)operator_new(0x80);
    verifier_13._3_1_ = 1;
    pCVar1 = (this->super_TestCaseGroup).m_context;
    std::__cxx11::string::string((string *)&verifierNdx_13);
    std::operator+(&local_618,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &verifierNdx_13,"image_binding_layer_");
    std::operator+(&local_5f8,&local_618,local_5d8);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    anon_unknown_1::ImageBindingLayerCase::ImageBindingLayerCase
              (this_04,pCVar1,pcVar3,"Test IMAGE_BINDING_LAYER",verifierSuffix_12._4_4_);
    verifier_13._3_1_ = QUERY_BOOLEAN >> 0x18;
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_04);
    std::__cxx11::string::~string((string *)&local_5f8);
    std::__cxx11::string::~string((string *)&local_618);
    std::__cxx11::string::~string((string *)&verifierNdx_13);
  }
  for (local_640 = 0; local_640 < 3; local_640 = local_640 + 1) {
    verifierSuffix_13._4_4_ = init::verifiers[local_640];
    local_650 = anon_unknown_1::getVerifierSuffix(verifierSuffix_13._4_4_);
    this_05 = (ImageBindingAccessCase *)operator_new(0x80);
    verifier_14._3_1_ = 1;
    pCVar1 = (this->super_TestCaseGroup).m_context;
    std::__cxx11::string::string((string *)&verifierNdx_14);
    std::operator+(&local_690,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &verifierNdx_14,"image_binding_access_");
    std::operator+(&local_670,&local_690,local_650);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    anon_unknown_1::ImageBindingAccessCase::ImageBindingAccessCase
              (this_05,pCVar1,pcVar3,"Test IMAGE_BINDING_ACCESS",verifierSuffix_13._4_4_);
    verifier_14._3_1_ = QUERY_BOOLEAN >> 0x18;
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_05);
    std::__cxx11::string::~string((string *)&local_670);
    std::__cxx11::string::~string((string *)&local_690);
    std::__cxx11::string::~string((string *)&verifierNdx_14);
  }
  for (local_6b8 = 0; local_6b8 < 3; local_6b8 = local_6b8 + 1) {
    verifierSuffix_14._4_4_ = init::verifiers[local_6b8];
    local_6c8 = anon_unknown_1::getVerifierSuffix(verifierSuffix_14._4_4_);
    this_06 = (ImageBindingFormatCase *)operator_new(0x80);
    verifierSuffix_15._7_1_ = 1;
    pCVar1 = (this->super_TestCaseGroup).m_context;
    std::__cxx11::string::string((string *)&verifier_15);
    std::operator+(&local_708,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&verifier_15
                   ,"image_binding_format_");
    std::operator+(&local_6e8,&local_708,local_6c8);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    anon_unknown_1::ImageBindingFormatCase::ImageBindingFormatCase
              (this_06,pCVar1,pcVar3,"Test IMAGE_BINDING_FORMAT",verifierSuffix_14._4_4_);
    verifierSuffix_15._7_1_ = 0;
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_06);
    std::__cxx11::string::~string((string *)&local_6e8);
    std::__cxx11::string::~string((string *)&local_708);
    std::__cxx11::string::~string((string *)&verifier_15);
  }
  verifierSuffix_15._0_4_ = 8;
  local_738 = anon_unknown_1::getVerifierSuffix(QUERY_INDEXED_ISENABLED);
  this_07 = (EnableBlendCase *)operator_new(0x80);
  verifier_16._3_1_ = 1;
  pCVar1 = (this->super_TestCaseGroup).m_context;
  std::__cxx11::string::string((string *)&verifierNdx_15);
  std::operator+(&local_778,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &verifierNdx_15,"blend_");
  std::operator+(&local_758,&local_778,local_738);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  anon_unknown_1::EnableBlendCase::EnableBlendCase
            (this_07,pCVar1,pcVar3,"BLEND",QUERY_INDEXED_ISENABLED);
  verifier_16._3_1_ = QUERY_BOOLEAN >> 0x18;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_07);
  std::__cxx11::string::~string((string *)&local_758);
  std::__cxx11::string::~string((string *)&local_778);
  iVar2 = std::__cxx11::string::~string((string *)&verifierNdx_15);
  local_7a0 = 0;
  while (local_7a0 < 3) {
    verifierSuffix_16._4_4_ = init::vec4Verifiers[local_7a0];
    local_7b0 = anon_unknown_1::getVerifierSuffix(verifierSuffix_16._4_4_);
    this_08 = (ColorMaskCase *)operator_new(0x80);
    verifier_17._3_1_ = 1;
    pCVar1 = (this->super_TestCaseGroup).m_context;
    std::__cxx11::string::string((string *)&verifierNdx_16);
    std::operator+(&local_7f0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &verifierNdx_16,"color_mask_");
    std::operator+(&local_7d0,&local_7f0,local_7b0);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    anon_unknown_1::ColorMaskCase::ColorMaskCase
              (this_08,pCVar1,pcVar3,"COLOR_WRITEMASK",verifierSuffix_16._4_4_);
    verifier_17._3_1_ = QUERY_BOOLEAN >> 0x18;
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_08);
    std::__cxx11::string::~string((string *)&local_7d0);
    std::__cxx11::string::~string((string *)&local_7f0);
    std::__cxx11::string::~string((string *)&verifierNdx_16);
    local_7a0 = local_7a0 + 1;
    iVar2 = local_7a0;
  }
  local_818 = 0;
  while (local_818 < 3) {
    verifierSuffix_17._4_4_ = init::verifiers[local_818];
    local_828 = anon_unknown_1::getVerifierSuffix(verifierSuffix_17._4_4_);
    this_09 = (BlendFuncCase *)operator_new(0x80);
    verifier_18._3_1_ = 1;
    pCVar1 = (this->super_TestCaseGroup).m_context;
    std::__cxx11::string::string((string *)&verifierNdx_17);
    std::operator+(&local_868,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &verifierNdx_17,"blend_func_");
    std::operator+(&local_848,&local_868,local_828);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    anon_unknown_1::BlendFuncCase::BlendFuncCase
              (this_09,pCVar1,pcVar3,"BLEND_SRC and BLEND_DST",verifierSuffix_17._4_4_);
    verifier_18._3_1_ = QUERY_BOOLEAN >> 0x18;
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_09);
    std::__cxx11::string::~string((string *)&local_848);
    std::__cxx11::string::~string((string *)&local_868);
    std::__cxx11::string::~string((string *)&verifierNdx_17);
    local_818 = local_818 + 1;
    iVar2 = local_818;
  }
  local_890 = 0;
  while (local_890 < 3) {
    verifierSuffix_18._4_4_ = init::verifiers[local_890];
    local_8a0 = anon_unknown_1::getVerifierSuffix(verifierSuffix_18._4_4_);
    this_10 = (BlendEquationCase *)operator_new(0x80);
    verifier_19._3_1_ = 1;
    pCVar1 = (this->super_TestCaseGroup).m_context;
    std::__cxx11::string::string((string *)&verifierNdx_18);
    std::operator+(&local_8e0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &verifierNdx_18,"blend_equation_");
    std::operator+(&local_8c0,&local_8e0,local_8a0);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    anon_unknown_1::BlendEquationCase::BlendEquationCase
              (this_10,pCVar1,pcVar3,"BLEND_EQUATION_RGB and BLEND_DST",verifierSuffix_18._4_4_);
    verifier_19._3_1_ = QUERY_BOOLEAN >> 0x18;
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_10);
    std::__cxx11::string::~string((string *)&local_8c0);
    std::__cxx11::string::~string((string *)&local_8e0);
    std::__cxx11::string::~string((string *)&verifierNdx_18);
    local_890 = local_890 + 1;
    iVar2 = local_890;
  }
  local_908 = 0;
  while (local_908 < 3) {
    verifierSuffix_19._4_4_ = init::verifiers[local_908];
    local_918 = anon_unknown_1::getVerifierSuffix(verifierSuffix_19._4_4_);
    this_11 = (BlendEquationAdvancedCase *)operator_new(0x80);
    pCVar1 = (this->super_TestCaseGroup).m_context;
    std::__cxx11::string::string((string *)&local_978);
    std::operator+(&local_958,&local_978,"blend_equation_advanced_");
    std::operator+(&local_938,&local_958,local_918);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    anon_unknown_1::BlendEquationAdvancedCase::BlendEquationAdvancedCase
              (this_11,pCVar1,pcVar3,"BLEND_EQUATION_RGB and BLEND_DST",verifierSuffix_19._4_4_);
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_11);
    std::__cxx11::string::~string((string *)&local_938);
    std::__cxx11::string::~string((string *)&local_958);
    std::__cxx11::string::~string((string *)&local_978);
    local_908 = local_908 + 1;
    iVar2 = local_908;
  }
  return iVar2;
}

Assistant:

void IndexedStateQueryTests::init (void)
{
	static const QueryType verifiers[] = { QUERY_INDEXED_BOOLEAN, QUERY_INDEXED_INTEGER, QUERY_INDEXED_INTEGER64 };
	static const QueryType vec4Verifiers[] = { QUERY_INDEXED_BOOLEAN_VEC4, QUERY_INDEXED_INTEGER_VEC4, QUERY_INDEXED_INTEGER64_VEC4 };

#define FOR_EACH_VERIFIER(X) \
	for (int verifierNdx = 0; verifierNdx < DE_LENGTH_OF_ARRAY(verifiers); ++verifierNdx)	\
	{																						\
		const QueryType verifier = verifiers[verifierNdx];									\
		const char* verifierSuffix = getVerifierSuffix(verifier);							\
		this->addChild(X);																	\
	}

#define FOR_EACH_VEC4_VERIFIER(X) \
	for (int verifierNdx = 0; verifierNdx < DE_LENGTH_OF_ARRAY(vec4Verifiers); ++verifierNdx)	\
	{																							\
		const QueryType verifier = vec4Verifiers[verifierNdx];									\
		const char* verifierSuffix = getVerifierSuffix(verifier);								\
		this->addChild(X);																		\
	}

	FOR_EACH_VERIFIER(new SampleMaskCase			(m_context, (std::string() + "sample_mask_value_" + verifierSuffix).c_str(),				"Test SAMPLE_MASK_VALUE", verifier))

	FOR_EACH_VERIFIER(new MinValueIndexed3Case		(m_context, (std::string() + "max_compute_work_group_count_" + verifierSuffix).c_str(),		"Test MAX_COMPUTE_WORK_GROUP_COUNT",	GL_MAX_COMPUTE_WORK_GROUP_COUNT,	tcu::IVec3(65535,65535,65535),	verifier))
	FOR_EACH_VERIFIER(new MinValueIndexed3Case		(m_context, (std::string() + "max_compute_work_group_size_" + verifierSuffix).c_str(),		"Test MAX_COMPUTE_WORK_GROUP_SIZE",		GL_MAX_COMPUTE_WORK_GROUP_SIZE,		tcu::IVec3(128, 128, 64),		verifier))

	FOR_EACH_VERIFIER(new BufferBindingCase			(m_context, (std::string() + "atomic_counter_buffer_binding_" + verifierSuffix).c_str(),	"Test ATOMIC_COUNTER_BUFFER_BINDING",	GL_ATOMIC_COUNTER_BUFFER_BINDING,	GL_ATOMIC_COUNTER_BUFFER,	GL_MAX_ATOMIC_COUNTER_BUFFER_BINDINGS,	verifier))
	FOR_EACH_VERIFIER(new BufferStartCase			(m_context, (std::string() + "atomic_counter_buffer_start_" + verifierSuffix).c_str(),		"Test ATOMIC_COUNTER_BUFFER_START",		GL_ATOMIC_COUNTER_BUFFER_START,		GL_ATOMIC_COUNTER_BUFFER,	GL_MAX_ATOMIC_COUNTER_BUFFER_BINDINGS,	verifier))
	FOR_EACH_VERIFIER(new BufferSizeCase			(m_context, (std::string() + "atomic_counter_buffer_size_" + verifierSuffix).c_str(),		"Test ATOMIC_COUNTER_BUFFER_SIZE",		GL_ATOMIC_COUNTER_BUFFER_SIZE,		GL_ATOMIC_COUNTER_BUFFER,	GL_MAX_ATOMIC_COUNTER_BUFFER_BINDINGS,	verifier))

	FOR_EACH_VERIFIER(new BufferBindingCase			(m_context, (std::string() + "shader_storage_buffer_binding_" + verifierSuffix).c_str(),	"Test SHADER_STORAGE_BUFFER_BINDING",	GL_SHADER_STORAGE_BUFFER_BINDING,	GL_SHADER_STORAGE_BUFFER,	GL_MAX_SHADER_STORAGE_BUFFER_BINDINGS,	verifier))
	FOR_EACH_VERIFIER(new BufferStartCase			(m_context, (std::string() + "shader_storage_buffer_start_" + verifierSuffix).c_str(),		"Test SHADER_STORAGE_BUFFER_START",		GL_SHADER_STORAGE_BUFFER_START,		GL_SHADER_STORAGE_BUFFER,	GL_MAX_SHADER_STORAGE_BUFFER_BINDINGS,	verifier))
	FOR_EACH_VERIFIER(new BufferSizeCase			(m_context, (std::string() + "shader_storage_buffer_size_" + verifierSuffix).c_str(),		"Test SHADER_STORAGE_BUFFER_SIZE",		GL_SHADER_STORAGE_BUFFER_SIZE,		GL_SHADER_STORAGE_BUFFER,	GL_MAX_SHADER_STORAGE_BUFFER_BINDINGS,	verifier))

	FOR_EACH_VERIFIER(new ImageBindingNameCase		(m_context, (std::string() + "image_binding_name_" + verifierSuffix).c_str(),				"Test IMAGE_BINDING_NAME",				verifier))
	FOR_EACH_VERIFIER(new ImageBindingLevelCase		(m_context, (std::string() + "image_binding_level_" + verifierSuffix).c_str(),				"Test IMAGE_BINDING_LEVEL",				verifier))
	FOR_EACH_VERIFIER(new ImageBindingLayeredCase	(m_context, (std::string() + "image_binding_layered_" + verifierSuffix).c_str(),			"Test IMAGE_BINDING_LAYERED",			verifier))
	FOR_EACH_VERIFIER(new ImageBindingLayerCase		(m_context, (std::string() + "image_binding_layer_" + verifierSuffix).c_str(),				"Test IMAGE_BINDING_LAYER",				verifier))
	FOR_EACH_VERIFIER(new ImageBindingAccessCase	(m_context, (std::string() + "image_binding_access_" + verifierSuffix).c_str(),				"Test IMAGE_BINDING_ACCESS",			verifier))
	FOR_EACH_VERIFIER(new ImageBindingFormatCase	(m_context, (std::string() + "image_binding_format_" + verifierSuffix).c_str(),				"Test IMAGE_BINDING_FORMAT",			verifier))

	{
		const QueryType verifier = QUERY_INDEXED_ISENABLED;
		const char* verifierSuffix = getVerifierSuffix(verifier);
		this->addChild(new EnableBlendCase			(m_context, (std::string() + "blend_" + verifierSuffix).c_str(),							"BLEND",								verifier));
	}
	FOR_EACH_VEC4_VERIFIER(new ColorMaskCase		(m_context, (std::string() + "color_mask_" + verifierSuffix).c_str(),						"COLOR_WRITEMASK",						verifier))
	FOR_EACH_VERIFIER(new BlendFuncCase				(m_context, (std::string() + "blend_func_" + verifierSuffix).c_str(),						"BLEND_SRC and BLEND_DST",				verifier))
	FOR_EACH_VERIFIER(new BlendEquationCase			(m_context, (std::string() + "blend_equation_" + verifierSuffix).c_str(),					"BLEND_EQUATION_RGB and BLEND_DST",		verifier))
	FOR_EACH_VERIFIER(new BlendEquationAdvancedCase	(m_context, (std::string() + "blend_equation_advanced_" + verifierSuffix).c_str(),			"BLEND_EQUATION_RGB and BLEND_DST",		verifier))

#undef FOR_EACH_VEC4_VERIFIER
#undef FOR_EACH_VERIFIER
}